

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON_Utils.c
# Opt level: O2

int compare_strings(uchar *string1,uchar *string2,cJSON_bool case_sensitive)

{
  int iVar1;
  __int32_t **pp_Var2;
  long lVar3;
  
  if (string2 == (uchar *)0x0 || string1 == (uchar *)0x0) {
    iVar1 = 1;
  }
  else if (string1 == string2) {
LAB_0010468d:
    iVar1 = 0;
  }
  else {
    if (case_sensitive != 0) {
      iVar1 = strcmp((char *)string1,(char *)string2);
      return iVar1;
    }
    pp_Var2 = __ctype_tolower_loc();
    lVar3 = 0;
    while( true ) {
      iVar1 = (*pp_Var2)[string1[lVar3]] - (*pp_Var2)[string2[lVar3]];
      if (iVar1 != 0) break;
      if (string1[lVar3] == 0) goto LAB_0010468d;
      lVar3 = lVar3 + 1;
    }
  }
  return iVar1;
}

Assistant:

static int compare_strings(const unsigned char *string1, const unsigned char *string2, const cJSON_bool case_sensitive)
{
    if ((string1 == NULL) || (string2 == NULL))
    {
        return 1;
    }

    if (string1 == string2)
    {
        return 0;
    }

    if (case_sensitive)
    {
        return strcmp((const char*)string1, (const char*)string2);
    }

    for(; tolower(*string1) == tolower(*string2); (void)string1++, string2++)
    {
        if (*string1 == '\0')
        {
            return 0;
        }
    }

    return tolower(*string1) - tolower(*string2);
}